

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_pedersen_commit
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,uchar *blind,
              uint64_t value,secp256k1_generator *value_gen,secp256k1_generator *blind_gen)

{
  uint uVar1;
  int overflow;
  secp256k1_ge r;
  secp256k1_gej rj;
  secp256k1_scalar sec;
  secp256k1_ge blind_genp;
  secp256k1_ge value_genp;
  secp256k1_scalar vs;
  int local_27c;
  secp256k1_gej local_278;
  secp256k1_gej local_1f8;
  secp256k1_scalar local_178;
  secp256k1_ge local_158;
  secp256k1_ge local_100;
  secp256k1_scalar local_a8;
  secp256k1_ge local_88;
  
  secp256k1_fe_set_b32(&local_100.x,value_gen->data);
  secp256k1_fe_set_b32(&local_100.y,value_gen->data + 0x20);
  uVar1 = 0;
  local_100.infinity = 0;
  secp256k1_fe_set_b32(&local_158.x,blind_gen->data);
  secp256k1_fe_set_b32(&local_158.y,blind_gen->data + 0x20);
  local_158.infinity = 0;
  secp256k1_scalar_set_b32(&local_178,blind,&local_27c);
  if (local_27c == 0) {
    local_a8.d[1] = 0;
    local_a8.d[2] = 0;
    local_a8.d[3] = 0;
    local_a8.d[0] = value;
    secp256k1_ecmult_const(&local_1f8,&local_100,&local_a8,0x40);
    secp256k1_ecmult_const(&local_278,&local_158,&local_178,0x100);
    if (local_278.infinity == 0) {
      secp256k1_ge_set_gej(&local_88,&local_278);
      secp256k1_gej_add_ge(&local_1f8,&local_1f8,&local_88);
    }
    local_278.z.n[4]._0_4_ = 0;
    local_278._116_8_ = 0;
    local_278.z.n[2] = 0;
    local_278.z.n[3]._0_4_ = 0;
    local_278.z.n[3]._4_4_ = 0;
    local_278.z.n[0] = 0;
    local_278.z.n[1] = 0;
    local_278.y.n[3] = 0;
    local_278.y.n[4] = 0;
    local_278.y.n[1] = 0;
    local_278.y.n[2] = 0;
    local_278.x.n[4] = 0;
    local_278.y.n[0] = 0;
    if (local_1f8.infinity == 0) {
      secp256k1_ge_set_gej((secp256k1_ge *)&local_278,&local_1f8);
      secp256k1_pedersen_commitment_save(commit,(secp256k1_ge *)&local_278);
    }
    uVar1 = (uint)(local_1f8.infinity == 0);
  }
  return uVar1;
}

Assistant:

int secp256k1_pedersen_commit(const secp256k1_context* ctx, secp256k1_pedersen_commitment *commit, const unsigned char *blind, uint64_t value, const secp256k1_generator* value_gen, const secp256k1_generator* blind_gen) {
    secp256k1_ge value_genp;
    secp256k1_ge blind_genp;
    secp256k1_gej rj;
    secp256k1_ge r;
    secp256k1_scalar sec;
    int overflow;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(value_gen != NULL);
    ARG_CHECK(blind_gen != NULL);
    secp256k1_generator_load(&value_genp, value_gen);
    secp256k1_generator_load(&blind_genp, blind_gen);
    secp256k1_scalar_set_b32(&sec, blind, &overflow);
    if (!overflow) {
        secp256k1_pedersen_ecmult(&rj, &sec, value, &value_genp, &blind_genp);
        if (!secp256k1_gej_is_infinity(&rj)) {
            secp256k1_ge_set_gej(&r, &rj);
            secp256k1_pedersen_commitment_save(commit, &r);
            ret = 1;
        }
        secp256k1_gej_clear(&rj);
        secp256k1_ge_clear(&r);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}